

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O2

int SHA1Reset(SHA1Context *context)

{
  if (context != (SHA1Context *)0x0) {
    context->Length_High = 0;
    context->Message_Block_Index = 0;
    context->Intermediate_Hash[0] = 0x67452301;
    context->Intermediate_Hash[1] = 0xefcdab89;
    context->Intermediate_Hash[2] = 0x98badcfe;
    context->Intermediate_Hash[3] = 0x10325476;
    *(undefined8 *)(context->Intermediate_Hash + 4) = 0xc3d2e1f0;
    context->Computed = 0;
    context->Corrupted = 0;
    return 0;
  }
  return 1;
}

Assistant:

int SHA1Reset(SHA1Context *context)
{
    if (!context)
        return shaNull;

    context->Length_Low = 0;
    context->Length_High = 0;
    context->Message_Block_Index = 0;


    /* Initial Hash Values: FIPS-180-2 section 5.3.1 */
    context->Intermediate_Hash[0] = 0x67452301;
    context->Intermediate_Hash[1] = 0xEFCDAB89;
    context->Intermediate_Hash[2] = 0x98BADCFE;
    context->Intermediate_Hash[3] = 0x10325476;
    context->Intermediate_Hash[4] = 0xC3D2E1F0;

    context->Computed = 0;
    context->Corrupted = 0;

    return shaSuccess;
}